

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void state_DCL(Context *ctx)

{
  RegisterType rtype;
  int regnum;
  MOJOSHADER_usage usage;
  TextureType ttype;
  char *reason;
  
  rtype = (ctx->dest_arg).regtype;
  regnum = (ctx->dest_arg).regnum;
  if (ctx->instruction_count != 0) {
    fail(ctx,"DCL token must come before any instructions");
    goto LAB_00111161;
  }
  if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
    ttype = ctx->dwords[0];
    if (rtype == REG_TYPE_SAMPLER) {
LAB_001111b7:
      add_sampler(ctx,regnum,ttype,0);
      goto LAB_00111161;
    }
  }
  else {
    if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) {
      reason = "unsupported shader type.";
LAB_001111cf:
      fail(ctx,reason);
      return;
    }
    ttype = ctx->dwords[0];
    if (rtype == REG_TYPE_SAMPLER) goto LAB_001111b7;
    if (0xd < (int)ttype) {
      reason = "unknown DCL usage";
      goto LAB_001111cf;
    }
  }
  add_attribute_register
            (ctx,rtype,regnum,ttype,ctx->dwords[1],(ctx->dest_arg).writemask,
             (ctx->dest_arg).result_mod);
LAB_00111161:
  set_defined_register(ctx,rtype,regnum);
  return;
}

Assistant:

static void state_DCL(Context *ctx)
{
    const DestArgInfo *arg = &ctx->dest_arg;
    const RegisterType regtype = arg->regtype;
    const int regnum = arg->regnum;
    const int wmask = arg->writemask;
    const int mods = arg->result_mod;

    // parse_args_DCL() does a lot of state checking before we get here.

    // !!! FIXME: apparently vs_3_0 can use sampler registers now.
    // !!! FIXME:  (but only s0 through s3, not all 16 of them.)

    if (ctx->instruction_count != 0)
        fail(ctx, "DCL token must come before any instructions");

    else if (shader_is_vertex(ctx))
    {
        if (regtype == REG_TYPE_SAMPLER)
            add_sampler(ctx, regnum, (TextureType) ctx->dwords[0], 0);
        else
        {
            const MOJOSHADER_usage usage = (const MOJOSHADER_usage) ctx->dwords[0];
            const int index = ctx->dwords[1];
            if (usage >= MOJOSHADER_USAGE_TOTAL)
            {
                fail(ctx, "unknown DCL usage");
                return;
            } // if
            add_attribute_register(ctx, regtype, regnum, usage, index, wmask, mods);
        } // else
    } // if

    else if (shader_is_pixel(ctx))
    {
        if (regtype == REG_TYPE_SAMPLER)
            add_sampler(ctx, regnum, (TextureType) ctx->dwords[0], 0);
        else
        {
            const MOJOSHADER_usage usage = (MOJOSHADER_usage) ctx->dwords[0];
            const int index = ctx->dwords[1];
            add_attribute_register(ctx, regtype, regnum, usage, index, wmask, mods);
        } // else
    } // else if

    else
    {
        fail(ctx, "unsupported shader type."); // should be caught elsewhere.
        return;
    } // else

    set_defined_register(ctx, regtype, regnum);
}